

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereCombineDisjuncts(SrcList *pSrc,WhereClause *pWC,WhereTerm *pOne,WhereTerm *pTwo)

{
  u8 uVar1;
  int iVar2;
  Expr *p;
  int idxNew;
  int op;
  Expr *pNew;
  sqlite3 *db;
  u16 eOp;
  WhereTerm *pTwo_local;
  WhereTerm *pOne_local;
  WhereClause *pWC_local;
  SrcList *pSrc_local;
  
  db._6_2_ = pOne->eOperator | pTwo->eOperator;
  if (((((pOne->eOperator & 0x3e) != 0) && ((pTwo->eOperator & 0x3e) != 0)) &&
      (((db._6_2_ & 0x1a) == db._6_2_ || ((db._6_2_ & 0x26) == db._6_2_)))) &&
     ((iVar2 = sqlite3ExprCompare((Parse *)0x0,pOne->pExpr->pLeft,pTwo->pExpr->pLeft,-1), iVar2 == 0
      && (iVar2 = sqlite3ExprCompare((Parse *)0x0,pOne->pExpr->pRight,pTwo->pExpr->pRight,-1),
         iVar2 == 0)))) {
    if ((db._6_2_ & db._6_2_ - 1) != 0) {
      if ((db._6_2_ & 0x18) == 0) {
        db._6_2_ = 0x20;
      }
      else {
        db._6_2_ = 8;
      }
    }
    p = sqlite3ExprDup(pWC->pWInfo->pParse->db,pOne->pExpr,0);
    if (p != (Expr *)0x0) {
      for (uVar1 = '5'; (uint)db._6_2_ != 2 << (uVar1 - 0x35 & 0x1f); uVar1 = uVar1 + '\x01') {
      }
      p->op = uVar1;
      iVar2 = whereClauseInsert(pWC,p,3);
      exprAnalyze(pSrc,pWC,iVar2);
    }
  }
  return;
}

Assistant:

static void whereCombineDisjuncts(
  SrcList *pSrc,         /* the FROM clause */
  WhereClause *pWC,      /* The complete WHERE clause */
  WhereTerm *pOne,       /* First disjunct */
  WhereTerm *pTwo        /* Second disjunct */
){
  u16 eOp = pOne->eOperator | pTwo->eOperator;
  sqlite3 *db;           /* Database connection (for malloc) */
  Expr *pNew;            /* New virtual expression */
  int op;                /* Operator for the combined expression */
  int idxNew;            /* Index in pWC of the next virtual term */

  if( (pOne->eOperator & (WO_EQ|WO_LT|WO_LE|WO_GT|WO_GE))==0 ) return;
  if( (pTwo->eOperator & (WO_EQ|WO_LT|WO_LE|WO_GT|WO_GE))==0 ) return;
  if( (eOp & (WO_EQ|WO_LT|WO_LE))!=eOp
   && (eOp & (WO_EQ|WO_GT|WO_GE))!=eOp ) return;
  assert( pOne->pExpr->pLeft!=0 && pOne->pExpr->pRight!=0 );
  assert( pTwo->pExpr->pLeft!=0 && pTwo->pExpr->pRight!=0 );
  if( sqlite3ExprCompare(0,pOne->pExpr->pLeft, pTwo->pExpr->pLeft, -1) ) return;
  if( sqlite3ExprCompare(0,pOne->pExpr->pRight, pTwo->pExpr->pRight,-1) )return;
  /* If we reach this point, it means the two subterms can be combined */
  if( (eOp & (eOp-1))!=0 ){
    if( eOp & (WO_LT|WO_LE) ){
      eOp = WO_LE;
    }else{
      assert( eOp & (WO_GT|WO_GE) );
      eOp = WO_GE;
    }
  }
  db = pWC->pWInfo->pParse->db;
  pNew = sqlite3ExprDup(db, pOne->pExpr, 0);
  if( pNew==0 ) return;
  for(op=TK_EQ; eOp!=(WO_EQ<<(op-TK_EQ)); op++){ assert( op<TK_GE ); }
  pNew->op = op;
  idxNew = whereClauseInsert(pWC, pNew, TERM_VIRTUAL|TERM_DYNAMIC);
  exprAnalyze(pSrc, pWC, idxNew);
}